

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

WalletBalances * __thiscall
wallet::anon_unknown_5::WalletImpl::getBalances
          (WalletBalances *__return_storage_ptr__,WalletImpl *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  Balance bal;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetBalance(&bal,(this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,0,true);
  __return_storage_ptr__->watch_only_balance = 0;
  __return_storage_ptr__->unconfirmed_watch_only_balance = 0;
  __return_storage_ptr__->immature_watch_only_balance = 0;
  *(undefined4 *)&__return_storage_ptr__->balance = (undefined4)bal.m_mine_trusted;
  *(undefined4 *)((long)&__return_storage_ptr__->balance + 4) = bal.m_mine_trusted._4_4_;
  *(undefined4 *)&__return_storage_ptr__->unconfirmed_balance =
       (undefined4)bal.m_mine_untrusted_pending;
  *(undefined4 *)((long)&__return_storage_ptr__->unconfirmed_balance + 4) =
       bal.m_mine_untrusted_pending._4_4_;
  __return_storage_ptr__->immature_balance = bal.m_mine_immature;
  iVar2 = (*(this->super_Wallet)._vptr_Wallet[0xf])(this);
  __return_storage_ptr__->have_watch_only = SUB41(iVar2,0);
  if (SUB41(iVar2,0) != false) {
    *(undefined4 *)&__return_storage_ptr__->watch_only_balance = (undefined4)bal.m_watchonly_trusted
    ;
    *(undefined4 *)((long)&__return_storage_ptr__->watch_only_balance + 4) =
         bal.m_watchonly_trusted._4_4_;
    *(undefined4 *)&__return_storage_ptr__->unconfirmed_watch_only_balance =
         (undefined4)bal.m_watchonly_untrusted_pending;
    *(undefined4 *)((long)&__return_storage_ptr__->unconfirmed_watch_only_balance + 4) =
         bal.m_watchonly_untrusted_pending._4_4_;
    __return_storage_ptr__->immature_watch_only_balance = bal.m_watchonly_immature;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

WalletBalances getBalances() override
    {
        const auto bal = GetBalance(*m_wallet);
        WalletBalances result;
        result.balance = bal.m_mine_trusted;
        result.unconfirmed_balance = bal.m_mine_untrusted_pending;
        result.immature_balance = bal.m_mine_immature;
        result.have_watch_only = haveWatchOnly();
        if (result.have_watch_only) {
            result.watch_only_balance = bal.m_watchonly_trusted;
            result.unconfirmed_watch_only_balance = bal.m_watchonly_untrusted_pending;
            result.immature_watch_only_balance = bal.m_watchonly_immature;
        }
        return result;
    }